

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

target_ulong helper_pext_x86_64(target_ulong src,target_ulong mask)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  
  if (mask != 0) {
    bVar3 = 0;
    uVar2 = 0;
    do {
      uVar1 = 0;
      if (mask != 0) {
        for (; (mask >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      uVar2 = uVar2 | (ulong)((src >> (uVar1 & 0x3f) & 1) != 0) << (bVar3 & 0x3f);
      bVar3 = bVar3 + 1;
      mask = mask & mask - 1;
    } while (mask != 0);
    return uVar2;
  }
  return 0;
}

Assistant:

target_ulong helper_pext(target_ulong src, target_ulong mask)
{
    target_ulong dest = 0;
    int i, o;

    for (o = 0; mask != 0; o++) {
        i = ctztl(mask);
        mask &= mask - 1;
        dest |= ((src >> i) & 1) << o;
    }
    return dest;
}